

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

int Fra_SmlNodeIsZero(Fra_Sml_t *p,Aig_Obj_t *pObj)

{
  uint *puVar1;
  int local_2c;
  int i;
  uint *pSims;
  Aig_Obj_t *pObj_local;
  Fra_Sml_t *p_local;
  
  puVar1 = Fra_ObjSim(p,pObj->Id);
  local_2c = p->nWordsPref;
  while( true ) {
    if (p->nWordsTotal <= local_2c) {
      return 1;
    }
    if (puVar1[local_2c] != 0) break;
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int Fra_SmlNodeIsZero( Fra_Sml_t * p, Aig_Obj_t * pObj )
{
    unsigned * pSims;
    int i;
    pSims = Fra_ObjSim(p, pObj->Id);
    for ( i = p->nWordsPref; i < p->nWordsTotal; i++ )
        if ( pSims[i] )
            return 0;
    return 1;
}